

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O2

void Abc_TruthReadHex(word *pTruth,char *pString,int nVars)

{
  byte bVar1;
  uint uVar2;
  char *__function;
  ulong uVar3;
  char *__assertion;
  ulong uVar4;
  int iVar5;
  
  uVar2 = 0x10 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar2 = 1 << ((char)nVars - 2U & 0x1f);
  }
  if (*pString == '0') {
    pString = pString + (ulong)(pString[1] == 'x') * 2;
  }
  if (((ulong)(byte)pString[(int)uVar2] < 0x21) &&
     ((0x100002401U >> ((ulong)(byte)pString[(int)uVar2] & 0x3f) & 1) != 0)) {
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    while( true ) {
      if (uVar3 == uVar4) {
        return;
      }
      bVar1 = pString[(int)(~(uint)uVar3 + uVar2)];
      iVar5 = -0x30;
      if (((9 < (byte)(bVar1 - 0x30)) && (iVar5 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
         (iVar5 = -0x57, 5 < (byte)(bVar1 + 0x9f))) break;
      pTruth[uVar3 >> 4 & 0xfffffff] =
           pTruth[uVar3 >> 4 & 0xfffffff] |
           (ulong)(iVar5 + (uint)bVar1) << ((char)uVar3 * '\x04' & 0x3fU);
      uVar3 = uVar3 + 1;
    }
    __assertion = "0";
    __function = "int Abc_TruthReadHexDigit(char)";
    uVar2 = 0x4d;
  }
  else {
    __assertion = 
    "EndSymbol == \' \' || EndSymbol == \'\\n\' || EndSymbol == \'\\r\' || EndSymbol == \'\\0\'";
    __function = "void Abc_TruthReadHex(word *, char *, int)";
    uVar2 = 0x69;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDec.c"
                ,uVar2,__function);
}

Assistant:

void Abc_TruthReadHex( word * pTruth, char * pString, int nVars )
{
    int nWords = (nVars < 7)? 1 : (1 << (nVars-6));
    int k, Digit, nDigits = (nVars < 7) ? (1 << (nVars-2)) : (nWords << 4);
    char EndSymbol;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // get the last symbol
    EndSymbol = pString[nDigits];
    // the end symbol of the TT (the one immediately following hex digits)
    // should be one of the following: space, a new-line, or a zero-terminator
    // (note that on Windows symbols '\r' can be inserted before each '\n')
    assert( EndSymbol == ' ' || EndSymbol == '\n' || EndSymbol == '\r' || EndSymbol == '\0' );
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TruthReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TruthSetHex( pTruth, k, Digit );
    }
}